

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_div(ASMState *as,IRIns *ir)

{
  long in_RSI;
  IRIns *in_RDI;
  undefined4 unaff_retaddr;
  x86Op unaff_retaddr_00;
  
  if ((*(byte *)(in_RSI + 4) & 0x1f) == 0xe) {
    asm_fparith(as,ir,unaff_retaddr_00);
  }
  else {
    asm_callid((ASMState *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_RDI,
               (IRCallID)((ulong)in_RSI >> 0x20));
  }
  return;
}

Assistant:

static void asm_div(ASMState *as, IRIns *ir)
{
#if LJ_64 && LJ_HASFFI
  if (!irt_isnum(ir->t))
    asm_callid(as, ir, irt_isi64(ir->t) ? IRCALL_lj_carith_divi64 :
					  IRCALL_lj_carith_divu64);
  else
#endif
    asm_fpdiv(as, ir);
}